

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  undefined8 uVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  bool bVar10;
  type_conflict5 tVar11;
  int iVar12;
  int iVar13;
  cpp_dec_float<50U,_int,_void> *v;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  int *local_228;
  int local_21c;
  cpp_dec_float<50U,_int,_void> local_218;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e0;
  int *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  int *local_1c8;
  int *local_1c0;
  int *local_1b8;
  pointer local_1b0;
  int *local_1a8;
  int *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  int *local_190;
  ulong local_188;
  int *local_180;
  ulong local_178;
  long local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar13 = rhsn;
  local_2a8.fpclass = cpp_dec_float_finite;
  local_2a8.prec_elem = 10;
  local_2a8.data._M_elems[0] = 0;
  local_2a8.data._M_elems[1] = 0;
  local_2a8.data._M_elems[2] = 0;
  local_2a8.data._M_elems[3] = 0;
  local_2a8.data._M_elems[4] = 0;
  local_2a8.data._M_elems[5] = 0;
  local_2a8.data._M_elems._24_5_ = 0;
  local_2a8.data._M_elems[7]._1_3_ = 0;
  local_2a8.data._M_elems._32_5_ = 0;
  local_2a8.data._M_elems[9]._1_3_ = 0;
  local_2a8.exp = 0;
  local_2a8.neg = false;
  local_1a0 = (this->row).orig;
  piVar16 = (this->col).orig;
  local_1d8 = (this->col).perm;
  local_21c = 0;
  local_228 = rhsidx;
  local_1e0 = this;
  local_1d0 = eps;
  local_198 = vec;
  local_190 = vecidx;
  while (local_21c < iVar13) {
    enQueueMin(local_228,&local_21c,local_1d8[local_228[local_21c]]);
  }
  local_1b0 = (local_1e0->u).row.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = (local_1e0->u).row.idx;
  local_1c0 = (local_1e0->u).row.len;
  local_1c8 = (local_1e0->u).row.start;
  uVar14 = 0;
  local_1a8 = piVar16;
  while (0 < iVar13) {
    iVar12 = deQueueMin(local_228,&rhsn);
    iVar13 = piVar16[iVar12];
    local_218.data._M_elems._32_8_ = *(undefined8 *)(rhs[iVar13].m_backend.data._M_elems + 8);
    local_218.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar13].m_backend.data._M_elems;
    local_218.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar13].m_backend.data._M_elems + 2);
    puVar2 = rhs[iVar13].m_backend.data._M_elems + 4;
    local_218.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_218.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_218.exp = rhs[iVar13].m_backend.exp;
    local_218.neg = rhs[iVar13].m_backend.neg;
    local_218.fpclass = rhs[iVar13].m_backend.fpclass;
    local_218.prec_elem = rhs[iVar13].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&rhs[iVar13].m_backend,0);
    local_68.m_backend.data._M_elems[0] = local_218.data._M_elems[0];
    local_68.m_backend.data._M_elems[1] = local_218.data._M_elems[1];
    local_68.m_backend.data._M_elems[2] = local_218.data._M_elems[2];
    local_68.m_backend.data._M_elems[3] = local_218.data._M_elems[3];
    local_68.m_backend.data._M_elems[4] = local_218.data._M_elems[4];
    local_68.m_backend.data._M_elems[5] = local_218.data._M_elems[5];
    local_68.m_backend.data._M_elems[6] = local_218.data._M_elems[6];
    local_68.m_backend.data._M_elems[7] = local_218.data._M_elems[7];
    local_68.m_backend.data._M_elems[8] = local_218.data._M_elems[8];
    local_68.m_backend.data._M_elems[9] = local_218.data._M_elems[9];
    local_68.m_backend.exp = local_218.exp;
    local_68.m_backend.neg = local_218.neg;
    local_68.m_backend.fpclass = local_218.fpclass;
    local_68.m_backend.prec_elem = local_218.prec_elem;
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_1d0->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_1d0->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_1d0->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_1d0->m_backend).data._M_elems + 6);
    local_a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_1d0->m_backend).data._M_elems + 8);
    local_a8.m_backend.exp = (local_1d0->m_backend).exp;
    local_a8.m_backend.neg = (local_1d0->m_backend).neg;
    local_a8.m_backend.fpclass = (local_1d0->m_backend).fpclass;
    local_a8.m_backend.prec_elem = (local_1d0->m_backend).prec_elem;
    bVar10 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_68,&local_a8);
    iVar13 = rhsn;
    if (bVar10) {
      iVar13 = local_1a0[iVar12];
      local_190[(int)uVar14] = iVar13;
      local_188 = uVar14;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_218,
                 &(local_1e0->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend);
      *(undefined8 *)local_198[iVar13].m_backend.data._M_elems = local_218.data._M_elems._0_8_;
      *(undefined8 *)(local_198[iVar13].m_backend.data._M_elems + 2) = local_218.data._M_elems._8_8_
      ;
      puVar2 = local_198[iVar13].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_218.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = local_218.data._M_elems._24_8_;
      *(undefined8 *)(local_198[iVar13].m_backend.data._M_elems + 8) =
           local_218.data._M_elems._32_8_;
      local_198[iVar13].m_backend.exp = local_218.exp;
      local_198[iVar13].m_backend.neg = local_218.neg;
      local_198[iVar13].m_backend.fpclass = local_218.fpclass;
      local_198[iVar13].m_backend.prec_elem = local_218.prec_elem;
      local_180 = local_1b8 + local_1c8[iVar13];
      v = &local_1b0[local_1c8[iVar13]].m_backend;
      local_178 = (ulong)(uint)local_1c0[iVar13];
      for (lVar15 = 0; (int)local_178 != (int)lVar15; lVar15 = lVar15 + 1) {
        local_170 = (long)local_180[lVar15];
        pnVar1 = rhs + local_170;
        uVar5 = *(undefined8 *)(rhs[local_170].m_backend.data._M_elems + 8);
        local_2a8.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)rhs[local_170].m_backend.data._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)(rhs[local_170].m_backend.data._M_elems + 2);
        puVar2 = rhs[local_170].m_backend.data._M_elems + 4;
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar5 = *(undefined8 *)(puVar2 + 2);
        local_2a8.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2a8.exp = rhs[local_170].m_backend.exp;
        local_2a8.neg = rhs[local_170].m_backend.neg;
        local_2a8.fpclass = rhs[local_170].m_backend.fpclass;
        local_2a8.prec_elem = rhs[local_170].m_backend.prec_elem;
        local_268.data._M_elems._0_8_ = local_268.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar11 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_2a8,(int *)&local_268);
        if (tVar11) {
          local_168.data._M_elems[0] = local_218.data._M_elems[0];
          local_168.data._M_elems[1] = local_218.data._M_elems[1];
          uVar5 = local_168.data._M_elems._0_8_;
          local_168.data._M_elems[2] = local_218.data._M_elems[2];
          local_168.data._M_elems[3] = local_218.data._M_elems[3];
          local_168.data._M_elems[8] = local_218.data._M_elems[8];
          local_168.data._M_elems[9] = local_218.data._M_elems[9];
          local_168.data._M_elems[4] = local_218.data._M_elems[4];
          local_168.data._M_elems[5] = local_218.data._M_elems[5];
          local_168.data._M_elems[6] = local_218.data._M_elems[6];
          local_168.data._M_elems[7] = local_218.data._M_elems[7];
          local_168.exp = local_218.exp;
          local_168.neg = local_218.neg;
          local_168.fpclass = local_218.fpclass;
          local_168.prec_elem = local_218.prec_elem;
          local_168.data._M_elems[0] = local_218.data._M_elems[0];
          if (local_218.fpclass != cpp_dec_float_finite || local_168.data._M_elems[0] != 0) {
            local_168.neg = (bool)(local_218.neg ^ 1);
          }
          local_268.fpclass = cpp_dec_float_finite;
          local_268.prec_elem = 10;
          local_268.data._M_elems[0] = 0;
          local_268.data._M_elems[1] = 0;
          local_268.data._M_elems[2] = 0;
          local_268.data._M_elems[3] = 0;
          local_268.data._M_elems[4] = 0;
          local_268.data._M_elems[5] = 0;
          local_268.data._M_elems._24_5_ = 0;
          local_268.data._M_elems[7]._1_3_ = 0;
          local_268.data._M_elems._32_5_ = 0;
          local_268.data._M_elems[9]._1_3_ = 0;
          local_268.exp = 0;
          local_268.neg = false;
          local_168.data._M_elems._0_8_ = uVar5;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_268,&local_168,v);
          local_128.m_backend.data._M_elems[9]._1_3_ = local_268.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems._32_5_ = local_268.data._M_elems._32_5_;
          local_2a8.data._M_elems._32_5_ = local_268.data._M_elems._32_5_;
          local_2a8.data._M_elems[9]._1_3_ = local_268.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
          local_128.m_backend.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
          local_2a8.data._M_elems[4] = local_268.data._M_elems[4];
          local_2a8.data._M_elems[5] = local_268.data._M_elems[5];
          local_2a8.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
          local_2a8.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
          local_2a8.data._M_elems[0] = local_268.data._M_elems[0];
          local_2a8.data._M_elems[1] = local_268.data._M_elems[1];
          local_2a8.data._M_elems[2] = local_268.data._M_elems[2];
          local_2a8.data._M_elems[3] = local_268.data._M_elems[3];
          local_2a8.exp = local_268.exp;
          local_2a8.neg = local_268.neg;
          local_128.m_backend.fpclass = local_268.fpclass;
          local_128.m_backend.prec_elem = local_268.prec_elem;
          local_2a8.fpclass = local_268.fpclass;
          local_2a8.prec_elem = local_268.prec_elem;
          local_128.m_backend.data._M_elems[0] = local_268.data._M_elems[0];
          local_128.m_backend.data._M_elems[1] = local_268.data._M_elems[1];
          local_128.m_backend.data._M_elems[2] = local_268.data._M_elems[2];
          local_128.m_backend.data._M_elems[3] = local_268.data._M_elems[3];
          local_128.m_backend.data._M_elems[4] = local_268.data._M_elems[4];
          local_128.m_backend.data._M_elems[5] = local_268.data._M_elems[5];
          local_128.m_backend.exp = local_268.exp;
          local_128.m_backend.neg = local_268.neg;
          local_e8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((local_1d0->m_backend).data._M_elems + 8);
          local_e8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(local_1d0->m_backend).data._M_elems;
          local_e8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((local_1d0->m_backend).data._M_elems + 2);
          local_e8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((local_1d0->m_backend).data._M_elems + 4);
          local_e8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((local_1d0->m_backend).data._M_elems + 6);
          local_e8.m_backend.exp = (local_1d0->m_backend).exp;
          local_e8.m_backend.neg = (local_1d0->m_backend).neg;
          local_e8.m_backend.fpclass = (local_1d0->m_backend).fpclass;
          local_e8.m_backend.prec_elem = (local_1d0->m_backend).prec_elem;
          bVar10 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_128,&local_e8);
          if (bVar10) {
            *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                 CONCAT35(local_2a8.data._M_elems[9]._1_3_,local_2a8.data._M_elems._32_5_);
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_2a8.data._M_elems._16_8_;
            *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                 CONCAT35(local_2a8.data._M_elems[7]._1_3_,local_2a8.data._M_elems._24_5_);
            *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_2a8.data._M_elems._0_8_;
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_2a8.data._M_elems._8_8_;
            (pnVar1->m_backend).exp = local_2a8.exp;
            (pnVar1->m_backend).neg = local_2a8.neg;
            (pnVar1->m_backend).fpclass = local_2a8.fpclass;
            (pnVar1->m_backend).prec_elem = local_2a8.prec_elem;
            enQueueMin(local_228,&rhsn,local_1d8[local_170]);
          }
        }
        else {
          local_268.fpclass = cpp_dec_float_finite;
          local_268.prec_elem = 10;
          local_268.data._M_elems[0] = 0;
          local_268.data._M_elems[1] = 0;
          local_268.data._M_elems[2] = 0;
          local_268.data._M_elems[3] = 0;
          local_268.data._M_elems[4] = 0;
          local_268.data._M_elems[5] = 0;
          local_268.data._M_elems._24_5_ = 0;
          local_268.data._M_elems[7]._1_3_ = 0;
          local_268.data._M_elems._32_5_ = 0;
          local_268.data._M_elems[9]._1_3_ = 0;
          local_268.exp = 0;
          local_268.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_268,&local_218,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_2a8,&local_268);
          local_168.data._M_elems._0_8_ = local_168.data._M_elems._0_8_ & 0xffffffff00000000;
          tVar11 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_2a8,(int *)&local_168);
          if (tVar11) {
            local_268.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
            local_268.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
            local_268.data._M_elems[4] = local_2a8.data._M_elems[4];
            local_268.data._M_elems[5] = local_2a8.data._M_elems[5];
            local_268.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
            local_268.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
            local_268.data._M_elems[0] = local_2a8.data._M_elems[0];
            local_268.data._M_elems[1] = local_2a8.data._M_elems[1];
            local_268.data._M_elems[2] = local_2a8.data._M_elems[2];
            local_268.data._M_elems[3] = local_2a8.data._M_elems[3];
            pcVar6 = &local_2a8;
            pcVar7 = &local_2a8;
            pcVar8 = &local_2a8;
            pcVar9 = &local_2a8;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_268,1e-100,(type *)0x0);
            pcVar6 = &local_268;
            pcVar7 = &local_268;
            pcVar8 = &local_268;
            pcVar9 = &local_268;
          }
          iVar13 = pcVar6->exp;
          bVar10 = pcVar7->neg;
          fVar3 = pcVar8->fpclass;
          iVar4 = pcVar9->prec_elem;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
               CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_268.data._M_elems._16_8_;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
               CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
          *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_268.data._M_elems._0_8_;
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_268.data._M_elems._8_8_;
          (pnVar1->m_backend).exp = iVar13;
          (pnVar1->m_backend).neg = bVar10;
          (pnVar1->m_backend).fpclass = fVar3;
          (pnVar1->m_backend).prec_elem = iVar4;
        }
        v = v + 1;
      }
      uVar14 = (ulong)((int)local_188 + 1);
      piVar16 = local_1a8;
      iVar13 = rhsn;
    }
  }
  return (int)uVar14;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}